

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshIO.hh
# Opt level: O0

bool OpenMesh::IO::read_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
               (PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *_mesh,string *_filename,
               Options *_opt,bool _clear)

{
  _IOManager_ *this;
  byte bVar1;
  byte in_CL;
  Options *in_RDX;
  string *in_RSI;
  ArrayKernel *in_RDI;
  IO *this_00;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> importer;
  undefined7 in_stack_ffffffffffffff80;
  PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *in_stack_ffffffffffffff88;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *in_stack_ffffffffffffff90;
  BaseImporter local_60 [8];
  byte local_19;
  Options *local_18;
  string *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_19 != 0) {
    ArrayKernel::clear(in_RDI);
  }
  this_00 = (IO *)local_60;
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::ImporterT
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this = (_IOManager_ *)IOManager(this_00);
  bVar1 = _IOManager_::read(this,local_10,local_60,local_18);
  ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::~ImporterT
            ((ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff80));
  return (bool)(bVar1 & 1);
}

Assistant:

bool
read_mesh(Mesh&         _mesh,
	  const std::string&  _filename,
	  Options&            _opt,
	  bool                _clear = true)
{
  if (_clear) _mesh.clear();
  ImporterT<Mesh> importer(_mesh);
  return IOManager().read(_filename, importer, _opt);
}